

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.cpp
# Opt level: O1

int GetHeadDataSeanetEx(SEANET *pSeanet,uchar *scanline,double *pAngle)

{
  HDCTRL *pHVar1;
  double dVar2;
  FILE *__stream;
  uchar *puVar3;
  int iVar4;
  ssize_t sVar5;
  char *pcVar6;
  timeval *ptVar7;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  size_t __nmemb;
  int byte;
  int Bearing;
  int *local_40a8;
  char SOf [4];
  int Node;
  int Min;
  int Hour;
  uchar *local_4090;
  int *local_4088;
  int *local_4080;
  HDCTRL *local_4078;
  int *local_4070;
  int *local_4068;
  int *local_4060;
  double *local_4058;
  double Seconds;
  char line [8193];
  char data [8193];
  
  if (bSeanetFromFile == 0) {
    builtin_strncpy(line,"@000C\f",7);
    line[7] = -1;
    line[8] = '\x02';
    line[9] = '\a';
    line[10] = '\x19';
    line[0xb] = -0x80;
    line[0xc] = '\x02';
    line[0xd] = '\0';
    line[0xe] = '\0';
    line[0xf] = '\0';
    line[0x10] = '\0';
    line[0x11] = '\n';
    iVar4 = (pSeanet->RS232Port).DevType;
    if (iVar4 - 1U < 4) {
      iVar4 = (pSeanet->RS232Port).s;
      uVar10 = 0;
      do {
        sVar5 = send(iVar4,line + uVar10,(long)(0x12 - (int)uVar10),0);
        if ((int)sVar5 < 1) goto LAB_001a008d;
        uVar9 = (int)uVar10 + (int)sVar5;
        uVar10 = (ulong)uVar9;
      } while ((int)uVar9 < 0x12);
    }
    else {
      if (iVar4 != 0) {
LAB_001a008d:
        pcVar6 = "Error writing data to a Seanet. ";
        goto LAB_001a0094;
      }
      iVar4 = *(int *)&(pSeanet->RS232Port).hDev;
      uVar10 = 0;
      do {
        sVar5 = write(iVar4,line + uVar10,(ulong)(0x12 - (int)uVar10));
        if ((int)sVar5 < 1) goto LAB_001a008d;
        uVar9 = (int)uVar10 + (int)sVar5;
        uVar10 = (ulong)uVar9;
      } while (uVar9 < 0x12);
    }
    iVar4 = HeadDataReplySeanet(pSeanet,scanline,pAngle);
    return (uint)(iVar4 != 0);
  }
  Hour = 0;
  Min = 0;
  Node = 0;
  Bearing = 0;
  Seconds = 0.0;
  byte = 0;
  line._0_8_ = (long)pSeanet->threadperiod / 1000;
  line._8_8_ = ((long)pSeanet->threadperiod % 1000) * 1000000;
  nanosleep((timespec *)line,(timespec *)0x0);
  pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
  if (seanetfilenextlinecmd < 1) {
    if (seanetfilenextlinecmd == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      return 0;
    }
  }
  else {
    seanetfilenextlinecmd = seanetfilenextlinecmd + -1;
  }
  local_4090 = scanline;
  local_4058 = pAngle;
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  __stream = seanetfile;
  do {
    while( true ) {
      pcVar6 = fgets(line,0x2001,(FILE *)__stream);
      if ((line[0] == '#') || (line[0] == '%')) break;
      if (((line[0] != '/') || (pcVar6 == (char *)0x0)) || (line[1] != '/')) goto LAB_0019fc91;
    }
  } while (pcVar6 != (char *)0x0);
LAB_0019fc91:
  if (pcVar6 == (char *)0x0 || line[0] == '$') {
    pcVar6 = "Error reading Seanet CSV file.";
LAB_001a0094:
    puts(pcVar6);
    return 1;
  }
  SOf[0] = '\0';
  SOf[1] = '\0';
  SOf[2] = '\0';
  SOf[3] = '\0';
  pcVar6 = data;
  data[0x2000] = '\0';
  Hdctrl.u = 0;
  local_4060 = &pSeanet->HeadStatus;
  pHVar1 = &pSeanet->HeadHdCtrl;
  local_4068 = &pSeanet->HeadRangescale;
  local_4070 = &pSeanet->HeadIGain;
  local_4080 = &pSeanet->HeadSlope;
  local_4088 = &pSeanet->HeadSteps;
  local_40a8 = &pSeanet->Dbytes;
  local_4078 = pHVar1;
  iVar4 = __isoc99_sscanf(line,"%03s,%d:%d:%lf,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%8192s",SOf,
                          &Hour,&Min,&Seconds,&Node,local_4060,pHVar1,local_4068,local_4070,
                          local_4080,&pSeanet->HeadADLow,&pSeanet->HeadADSpan,&pSeanet->HeadLeftLim,
                          &pSeanet->HeadRightLim,local_4088,&Bearing,local_40a8,pcVar6);
  if (iVar4 != 0x12) {
    puts("Skipping an invalid line in the CSV file.");
    return 0;
  }
  pSeanet->bDST = (uint)(SOf == (char  [4])0x474944);
  uVar9 = (pSeanet->HeadHdCtrl).u & 1;
  pSeanet->adc8on = uVar9;
  pSeanet->HeadNBins = pSeanet->Dbytes << ((byte)uVar9 ^ 1);
  dVar2 = (double)pSeanet->HeadSteps * 0.05625;
  pSeanet->NSteps = (int)(360.0 / dVar2);
  pSeanet->StepAngleSize = dVar2;
  pSeanet->RangeScale = pSeanet->HeadRangescale / 10;
  pthread_mutex_lock((pthread_mutex_t *)&SeanetConnectingCS);
  if ((((AdLow == pSeanet->HeadADLow) && (AdSpan == pSeanet->HeadADSpan)) &&
      ((Steps == *local_4088 && ((Hdctrl.u == pHVar1->u && (NBins == pSeanet->HeadNBins)))))) &&
     (NSteps == pSeanet->NSteps)) {
    if (((StepAngleSize == pSeanet->StepAngleSize) &&
        (!NAN(StepAngleSize) && !NAN(pSeanet->StepAngleSize))) &&
       (rangescale == pSeanet->RangeScale)) goto LAB_001a00c2;
  }
  AdSpan = pSeanet->HeadADSpan;
  Steps = pSeanet->HeadSteps;
  Hdctrl = pSeanet->HeadHdCtrl;
  NBins = pSeanet->HeadNBins;
  NSteps = pSeanet->NSteps;
  StepAngleSize = pSeanet->StepAngleSize;
  rangescale = pSeanet->RangeScale;
  index_scanlines_prev = 0;
  index_scanlines = 0;
  AdLow = pSeanet->HeadADLow;
  free(tvs);
  free(angles);
  free(scanlines);
  tvs = (timeval *)0x0;
  angles = (double *)0x0;
  scanlines = (uchar *)0x0;
  __nmemb = (size_t)NSteps;
  ptVar7 = (timeval *)calloc(__nmemb,0x10);
  tvs = ptVar7;
  pdVar8 = (double *)calloc(__nmemb,8);
  angles = pdVar8;
  scanlines = (uchar *)calloc(__nmemb << 0xb,1);
  if ((pdVar8 == (double *)0x0 || ptVar7 == (timeval *)0x0) || scanlines == (uchar *)0x0) {
    puts("Unable to allocate Seanet data.");
    pthread_mutex_unlock((pthread_mutex_t *)&SeanetConnectingCS);
    return 1;
  }
LAB_001a00c2:
  pthread_mutex_unlock((pthread_mutex_t *)&SeanetConnectingCS);
  puVar3 = local_4090;
  *local_4058 = (double)(Bearing + ((Bearing + 0xc80) / 0x1900) * -0x1900 + 0xc80) * 0.05625;
  if ((Hdctrl.u & 1) != 0) {
    if (*local_40a8 < 1) {
      return 0;
    }
    lVar11 = 0;
    do {
      __isoc99_sscanf(pcVar6,"%d",&byte);
      puVar3[lVar11] = (byte)byte;
      pcVar6 = strchr(pcVar6,0x2c);
      if (pcVar6 == (char *)0x0) {
        return 0;
      }
      pcVar6 = pcVar6 + 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *local_40a8);
    return 0;
  }
  if (0 < *local_40a8) {
    pcVar6 = data;
    lVar11 = 0;
    do {
      __isoc99_sscanf(pcVar6,"%d",&byte);
      puVar3[lVar11 * 2] = (byte)byte & 0xf0;
      puVar3[lVar11 * 2 + 1] = (byte)byte << 4;
      pcVar6 = strchr(pcVar6,0x2c);
      if (pcVar6 == (char *)0x0) {
        return 0;
      }
      pcVar6 = pcVar6 + 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *local_40a8);
    return 0;
  }
  return 0;
}

Assistant:

int GetHeadDataSeanetEx(SEANET* pSeanet, unsigned char* scanline, double* pAngle)
{
	if (!bSeanetFromFile) return GetHeadDataSeanet(pSeanet, scanline, pAngle);
	else
	{
		char line[4*MAX_NB_BYTES_SEANET+1];
		int i = 0;

		int Hour = 0, Min = 0, Node = 0, Bearing = 0;
		double Seconds = 0;
		char SOf[3+1];
		char data[4*MAX_NB_BYTES_SEANET+1];
		char* str = NULL;
		int byte = 0;

		mSleep(pSeanet->threadperiod);

		EnterCriticalSection(&StateVariablesCS);
		if (seanetfilenextlinecmd > 0) seanetfilenextlinecmd--;
		else if (seanetfilenextlinecmd == 0) { LeaveCriticalSection(&StateVariablesCS); return EXIT_SUCCESS; }
		LeaveCriticalSection(&StateVariablesCS);

		// Get a sonar scanline from the file.
		if (fgets3(seanetfile, line, sizeof(line)) == NULL)
		{
			printf("Error reading Seanet CSV file.\n");
			return EXIT_FAILURE;
		}

		memset(SOf, 0, sizeof(SOf));
		//memset(data, 0, sizeof(data));
		data[sizeof(data)-1] = 0; // The last character must be a 0 to be a valid string for sscanf.
		Hdctrl.i = 0;

		if (sscanf(line, "%03s,%d:%d:%lf,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%8192s",
			SOf, &Hour, &Min, &Seconds, &Node, &pSeanet->HeadStatus, &pSeanet->HeadHdCtrl.i, &pSeanet->HeadRangescale, &pSeanet->HeadIGain, &pSeanet->HeadSlope,
			&pSeanet->HeadADLow, &pSeanet->HeadADSpan, &pSeanet->HeadLeftLim, &pSeanet->HeadRightLim, &pSeanet->HeadSteps, &Bearing, &pSeanet->Dbytes, data) != 18)
		{
			printf("Skipping an invalid line in the CSV file.\n");
			return EXIT_SUCCESS;
		}

		if (strcmp(SOf, "DIG") == 0) pSeanet->bDST = TRUE; else pSeanet->bDST = FALSE;
		pSeanet->adc8on = (BOOL)pSeanet->HeadHdCtrl.bits.adc8on;
		pSeanet->HeadNBins = pSeanet->HeadHdCtrl.bits.adc8on?pSeanet->Dbytes:2*pSeanet->Dbytes;
		pSeanet->NSteps = RESOLUTION2NUMBER_OF_STEPS(pSeanet->HeadSteps);
		pSeanet->StepAngleSize = RESOLUTION2STEP_ANGLE_SIZE_IN_DEGREES(pSeanet->HeadSteps);
		pSeanet->RangeScale = pSeanet->HeadRangescale/10;


		// To check and put in common code (change return with break, etc.)...?

		EnterCriticalSection(&SeanetConnectingCS);
		if ((AdLow != pSeanet->HeadADLow)||(AdSpan != pSeanet->HeadADSpan)||(Steps != pSeanet->HeadSteps)||(Hdctrl.u != pSeanet->HeadHdCtrl.u)||(NBins != pSeanet->HeadNBins)||
			(NSteps != pSeanet->NSteps)||(StepAngleSize != pSeanet->StepAngleSize)||(rangescale != pSeanet->RangeScale))
		{
			AdLow = pSeanet->HeadADLow; AdSpan = pSeanet->HeadADSpan; Steps = pSeanet->HeadSteps; Hdctrl.u = pSeanet->HeadHdCtrl.u; NBins = pSeanet->HeadNBins;
			NSteps = pSeanet->NSteps; StepAngleSize = pSeanet->StepAngleSize; rangescale = pSeanet->RangeScale;

			index_scanlines_prev = 0;
			index_scanlines = 0;

			free(tvs); free(angles); free(scanlines);
			tvs = NULL; angles = NULL; scanlines = NULL;
			tvs = (struct timeval*)calloc(NSteps, sizeof(struct timeval));
			angles = (double*)calloc(NSteps, sizeof(double));
			scanlines = (unsigned char*)calloc(NSteps*MAX_NB_BYTES_SEANET, sizeof(unsigned char));
			if ((tvs == NULL)||(angles == NULL)||(scanlines == NULL))
			{
				printf("Unable to allocate Seanet data.\n");
				LeaveCriticalSection(&SeanetConnectingCS);
				return EXIT_FAILURE;
			}
		}
		LeaveCriticalSection(&SeanetConnectingCS);


		//tv.tv_sec = Hour*3600+Min*60+(long)Seconds;
		//tv.tv_usec = (long)((Seconds-(long)Seconds)*1000000.0);
		*pAngle = ((Bearing-3200+6400)%6400)*0.05625; // Angle of the transducer in degrees (0.05625 = (1/16)*(9/10)).

		// We should take into account ADLow and ADSpan here?

		str = data;
		if (!Hdctrl.bits.adc8on)
		{
			for (i = 0; i < pSeanet->Dbytes; i++)
			{
				(void)sscanf(str, "%d", &byte);
				scanline[2*i+0] = (unsigned char)((byte>>4)*16);
				scanline[2*i+1] = (unsigned char)(((byte<<4)>>4)*16);
				str = strchr(str, ',');
				if (!str) break;
				str++;
			}
		}
		else
		{
			for (i = 0; i < pSeanet->Dbytes; i++)
			{
				(void)sscanf(str, "%d", &byte);
				scanline[i] = (unsigned char)byte;
				str = strchr(str, ',');
				if (!str) break;
				str++;
			}
		}

		return EXIT_SUCCESS;
	}
}